

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O1

int main(void)

{
  char cVar1;
  long *plVar2;
  undefined8 uVar3;
  user_pointer uVar4;
  int binding;
  funcptr<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_demo_cpp:37:26),_void>
  another_lambda;
  funcptr<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_demo_cpp:32:18),_void>
  lambda;
  funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void> fnobj;
  int local_ac;
  _Any_data local_a8;
  _Manager_type local_98;
  code *pcStack_90;
  int local_7c;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"before",6);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  uVar4.value = (void *)(ulong)(uint)(int)cVar1;
  std::ostream::put('X');
  std::ostream::flush();
  test(0x2a,uVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"after",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  local_a8._8_8_ = 0;
  local_a8._M_unused._M_object = test;
  pcStack_90 = std::
               _Function_handler<void_(int,_func_ptr::user_pointer),_void_(*)(int,_func_ptr::user_pointer)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(int,_func_ptr::user_pointer),_void_(*)(int,_func_ptr::user_pointer)>
             ::_M_manager;
  std::function<void_(int,_func_ptr::user_pointer)>::function
            ((function<void_(int,_func_ptr::user_pointer)> *)&local_38,
             (function<void_(int,_func_ptr::user_pointer)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"before",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  local_58._0_4_ = 0x2a;
  local_a8._M_unused._M_object = &local_38;
  if (local_28 == (code *)0x0) {
    std::__throw_bad_function_call();
  }
  else {
    (*local_20)(&local_38,(user_pointer *)&local_58,(int *)local_a8._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"after",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    local_a8._8_8_ = 0;
    pcStack_90 = std::
                 _Function_handler<void_(int,_func_ptr::user_pointer),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/demo.cpp:32:18)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(int,_func_ptr::user_pointer),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/demo.cpp:32:18)>
               ::_M_manager;
    local_a8._M_unused._M_object = &local_ac;
    std::function<void_(int,_func_ptr::user_pointer)>::function
              ((function<void_(int,_func_ptr::user_pointer)> *)&local_58,
               (function<void_(int,_func_ptr::user_pointer)> *)&local_a8);
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"before",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    local_78._0_4_ = 0x2a;
    local_a8._M_unused._M_object = &local_58;
    if (local_48 != (code *)0x0) {
      (*local_40)(&local_58,(user_pointer *)&local_78,(int *)local_a8._M_pod_data);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"after",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[main] got ",0xb);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_ac);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      local_a8._8_8_ = 0;
      pcStack_90 = std::
                   _Function_handler<void_(func_ptr::user_pointer,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/demo.cpp:37:26)>
                   ::_M_invoke;
      local_98 = std::
                 _Function_handler<void_(func_ptr::user_pointer,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/demo.cpp:37:26)>
                 ::_M_manager;
      local_a8._M_unused._M_object = &local_ac;
      std::function<void_(func_ptr::user_pointer,_int)>::function
                ((function<void_(func_ptr::user_pointer,_int)> *)&local_78,
                 (function<void_(func_ptr::user_pointer,_int)> *)&local_a8);
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[another] before",0x10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      local_7c = 0xe9;
      local_a8._M_unused._M_object = &local_78;
      if (local_68 != (code *)0x0) {
        (*local_60)(&local_78,(user_pointer *)&local_a8,&local_7c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[another] after",0xf);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[main] got ",0xb);
        plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_ac);
        std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
        std::ostream::put((char)plVar2);
        std::ostream::flush();
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,__destroy_functor);
        }
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,__destroy_functor);
        }
        if (local_28 != (code *)0x0) {
          (*local_28)(&local_38,&local_38,__destroy_functor);
        }
        return 0;
      }
      goto LAB_0010185d;
    }
  }
  std::__throw_bad_function_call();
LAB_0010185d:
  uVar3 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar3);
}

Assistant:

int main() {
  funcptr fn{test};
  fake_clib_func(fn, fn.holder());

  funcptr fnobj{std::function<void(int, user_pointer)>{test}};
  fake_clib_func(fnobj, fnobj.holder());

  int binding;

  funcptr lambda{[&](int input, user_pointer) { binding = input; }};
  fake_clib_func(lambda, lambda.holder());

  std::cout << "[main] got " << binding << std::endl;

  funcptr another_lambda{[&](user_pointer, int input) { binding = input; }};
  another_clib_func(another_lambda, another_lambda.holder());

  std::cout << "[main] got " << binding << std::endl;
}